

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O2

void std::
     __move_median_to_first<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::item>>>,__gnu_cxx::__ops::_Iter_less_iter>
               (undefined8 *__result,longdouble *__a,longdouble *__b,longdouble *__c)

{
  longdouble lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  longdouble lVar15;
  longdouble lVar16;
  item __tmp;
  
  lVar15 = (longdouble)*(int *)(__a + 2);
  lVar16 = *__a / lVar15;
  lVar1 = *__b;
  if (lVar1 / lVar15 <= lVar16) {
    if (lVar16 < *__c / lVar15) goto LAB_00522968;
    if (lVar1 / (longdouble)*(int *)(__b + 2) < *__c / (longdouble)*(int *)(__b + 2))
    goto LAB_005229bd;
  }
  else if (*__c / (longdouble)*(int *)(__b + 2) <= lVar1 / (longdouble)*(int *)(__b + 2)) {
    if (lVar16 < *__c / lVar15) {
LAB_005229bd:
      uVar2 = *__result;
      uVar3 = __result[1];
      uVar4 = __result[2];
      uVar5 = __result[3];
      uVar6 = __result[4];
      uVar7 = __result[5];
      uVar8 = *(undefined8 *)__c;
      uVar9 = *(undefined8 *)((long)__c + 8);
      uVar10 = *(undefined8 *)(__c + 1);
      uVar11 = *(undefined8 *)((long)__c + 0x18);
      uVar12 = *(undefined8 *)((long)__c + 0x18);
      uVar13 = *(undefined8 *)(__c + 2);
      uVar14 = *(undefined8 *)((long)__c + 0x28);
      __result[2] = *(undefined8 *)(__c + 1);
      __result[3] = uVar12;
      __result[4] = uVar13;
      __result[5] = uVar14;
      *__result = uVar8;
      __result[1] = uVar9;
      __result[2] = uVar10;
      __result[3] = uVar11;
      *(undefined8 *)(__c + 1) = uVar4;
      *(undefined8 *)((long)__c + 0x18) = uVar5;
      *(undefined8 *)(__c + 2) = uVar6;
      *(undefined8 *)((long)__c + 0x28) = uVar7;
      *(undefined8 *)__c = uVar2;
      *(undefined8 *)((long)__c + 8) = uVar3;
      *(undefined8 *)(__c + 1) = uVar4;
      *(undefined8 *)((long)__c + 0x18) = uVar5;
      return;
    }
LAB_00522968:
    uVar2 = *__result;
    uVar3 = __result[1];
    uVar4 = __result[2];
    uVar5 = __result[3];
    uVar6 = __result[4];
    uVar7 = __result[5];
    uVar8 = *(undefined8 *)__a;
    uVar9 = *(undefined8 *)((long)__a + 8);
    uVar10 = *(undefined8 *)(__a + 1);
    uVar11 = *(undefined8 *)((long)__a + 0x18);
    uVar12 = *(undefined8 *)((long)__a + 0x18);
    uVar13 = *(undefined8 *)(__a + 2);
    uVar14 = *(undefined8 *)((long)__a + 0x28);
    __result[2] = *(undefined8 *)(__a + 1);
    __result[3] = uVar12;
    __result[4] = uVar13;
    __result[5] = uVar14;
    *__result = uVar8;
    __result[1] = uVar9;
    __result[2] = uVar10;
    __result[3] = uVar11;
    *(undefined8 *)(__a + 1) = uVar4;
    *(undefined8 *)((long)__a + 0x18) = uVar5;
    *(undefined8 *)(__a + 2) = uVar6;
    *(undefined8 *)((long)__a + 0x28) = uVar7;
    *(undefined8 *)__a = uVar2;
    *(undefined8 *)((long)__a + 8) = uVar3;
    *(undefined8 *)(__a + 1) = uVar4;
    *(undefined8 *)((long)__a + 0x18) = uVar5;
    return;
  }
  uVar2 = *__result;
  uVar3 = __result[1];
  uVar4 = __result[2];
  uVar5 = __result[3];
  uVar6 = __result[4];
  uVar7 = __result[5];
  uVar8 = *(undefined8 *)__b;
  uVar9 = *(undefined8 *)((long)__b + 8);
  uVar10 = *(undefined8 *)(__b + 1);
  uVar11 = *(undefined8 *)((long)__b + 0x18);
  uVar12 = *(undefined8 *)((long)__b + 0x18);
  uVar13 = *(undefined8 *)(__b + 2);
  uVar14 = *(undefined8 *)((long)__b + 0x28);
  __result[2] = *(undefined8 *)(__b + 1);
  __result[3] = uVar12;
  __result[4] = uVar13;
  __result[5] = uVar14;
  *__result = uVar8;
  __result[1] = uVar9;
  __result[2] = uVar10;
  __result[3] = uVar11;
  *(undefined8 *)(__b + 1) = uVar4;
  *(undefined8 *)((long)__b + 0x18) = uVar5;
  *(undefined8 *)(__b + 2) = uVar6;
  *(undefined8 *)((long)__b + 0x28) = uVar7;
  *(undefined8 *)__b = uVar2;
  *(undefined8 *)((long)__b + 8) = uVar3;
  *(undefined8 *)(__b + 1) = uVar4;
  *(undefined8 *)((long)__b + 0x18) = uVar5;
  return;
}

Assistant:

constexpr bool operator<(const item& other) const noexcept
        {
            if constexpr (std::is_same_v<Mode, minimize_tag>)
                return (r / static_cast<Float>(factor)) <
                       (other.r / static_cast<Float>(factor));
            else
                return (other.r / static_cast<Float>(factor)) <
                       (r / static_cast<Float>(factor));
        }